

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O1

void * mpp_enc_thread(void *data)

{
  RK_S32 *pRVar1;
  MppEncImpl *enc;
  MppThread *pMVar2;
  MppEncImpl *pMVar3;
  EncImpl pvVar4;
  Mpp *mpp;
  MppEnc pvVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  RK_S32 RVar10;
  MppEncRefMode MVar11;
  RK_S32 RVar12;
  MppTask *ppvVar13;
  pthread_mutex_t *__mutex;
  MppFrame *ppvVar14;
  RK_U8 *pRVar15;
  MppPacket *packet;
  byte bVar16;
  MppThreadStatus MVar17;
  MPP_RET MVar18;
  RK_U32 RVar19;
  RK_S64 RVar20;
  MppStopwatch stopwatch;
  MppBuffer pvVar21;
  size_t sVar22;
  void *pvVar23;
  void *pvVar24;
  uint uVar25;
  EncAsyncStatus EVar26;
  char *pcVar27;
  undefined4 uVar28;
  ulong uVar29;
  uint uVar30;
  MppPacket pvVar31;
  undefined8 uVar32;
  MppPskipMode MVar33;
  RK_U8 *pRVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  MppPskipMode skip_mode;
  EncAsyncTaskInfo task;
  void *in_stack_fffffffffffffcb8;
  size_t in_stack_fffffffffffffcc0;
  uint local_31c;
  MppPskipMode local_310;
  void *local_308;
  MppPacket local_300;
  MppTask *local_2f8;
  pthread_mutex_t *local_2f0;
  MppEncRefFrmUsrCfg *local_2e8;
  MppBuffer *local_2e0;
  MppThread *local_2d8;
  MppFrame *local_2d0;
  EncAsyncTaskInfo local_2c8;
  pthread_mutex_t *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  MppEncRefFrmUsrCfg *local_78;
  MppBuffer *local_70;
  MppPacket *local_68;
  MppTask *local_60;
  EncRcTaskInfo *local_58;
  sem_t *local_50;
  sem_t *local_48;
  sem_t *local_40;
  pthread_cond_t *local_38;
  
  enc = *(MppEncImpl **)((long)data + 0xb0);
  pMVar2 = enc->thread_enc;
  local_308 = data;
  memset(&local_2c8,0,0x238);
  RVar20 = mpp_time();
  enc->time_base = RVar20;
  local_2f0 = (pthread_mutex_t *)pMVar2->mMutexCond;
  pthread_mutex_lock(local_2f0);
  local_2d8 = pMVar2;
  MVar17 = MppThread::get_status(pMVar2,THREAD_WORK);
  bVar36 = MVar17 == MPP_THREAD_RUNNING;
  if (!bVar36) {
LAB_0014117c:
    pthread_mutex_unlock(local_2f0);
LAB_00141186:
    release_task_in_port(enc->input);
    release_task_in_port(*(MppPort *)((long)local_308 + 0x58));
    return (void *)0x0;
  }
  local_38 = (pthread_cond_t *)&local_2d8->mMutexCond[0].mCondition;
  local_40 = (sem_t *)&enc->cmd_start;
  local_48 = (sem_t *)&enc->cmd_done;
  local_90 = (pthread_mutex_t *)(local_2d8->mMutexCond + 3);
  local_50 = (sem_t *)&enc->enc_reset;
  local_2e8 = &local_2c8.usr;
  local_2f8 = &enc->task_in;
  local_60 = &enc->task_out;
  local_2d0 = &enc->frame;
  local_68 = &enc->packet;
  local_70 = &enc->md_info;
  local_2e0 = &enc->frm_buf;
  local_78 = &enc->frm_cfg;
  local_58 = &enc->rc_info_prev;
  local_31c = 0;
LAB_0013e23e:
  uVar30 = enc->notify_flag;
  RVar19 = 0;
  bVar35 = true;
  if (enc->reset_flag == 0) {
    if ((uVar30 & 0x10) != 0) {
      RVar19 = uVar30 & 0xffffffef;
      goto LAB_0013e28d;
    }
    bVar37 = (uVar30 & local_31c) != 0;
    bVar35 = bVar37 || (short)local_31c == 0;
    pcVar27 = "wait";
    if (bVar37 || (short)local_31c == 0) {
      pcVar27 = "work";
    }
  }
  else {
LAB_0013e28d:
    pcVar27 = "work";
  }
  if (((byte)mpp_enc_debug & 0x10) != 0) {
    in_stack_fffffffffffffcc0 =
         CONCAT44((int)(in_stack_fffffffffffffcc0 >> 0x20),~local_31c & enc->status_flag);
    in_stack_fffffffffffffcb8 =
         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),local_31c);
    _mpp_log_l(4,"mpp_enc","%p %08x -> %08x [%08x] notify %08x -> %s\n","check_enc_task_wait",enc,
               (ulong)enc->status_flag,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0,uVar30,
               pcVar27);
  }
  pMVar2 = local_2d8;
  enc->status_flag = local_31c;
  enc->notify_flag = RVar19;
  if (bVar35) {
    enc->work_count = enc->work_count + 1;
  }
  else {
    enc->wait_count = enc->wait_count + 1;
    MVar17 = local_2d8->mStatus[0];
    local_2d8->mStatus[0] = MPP_THREAD_WAITING;
    pthread_cond_wait(local_38,local_2f0);
    if (pMVar2->mStatus[0] == MPP_THREAD_WAITING) {
      local_2d8->mStatus[0] = MVar17;
    }
  }
  pthread_mutex_unlock(local_2f0);
  if (bVar36) {
    if ((local_2c8.status.val >> 8 & 1) == 0) {
      if (enc->cmd_send == enc->cmd_recv) {
        if (enc->reset_flag == 0) {
          MVar18 = MPP_OK;
          if ((local_2c8.status.val & 2) == 0) {
            MVar18 = _mpp_port_poll("try_get_enc_task",enc->input,MPP_POLL_NON_BLOCK);
            if (MPP_NOK < MVar18) {
              local_2c8.status.val = local_2c8.status.val | 2;
              local_31c = local_31c & 0xfffe;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task in ready\n","try_get_enc_task");
              }
              goto LAB_0013e8aa;
            }
            local_31c = local_31c | 1;
LAB_0013e921:
            bVar36 = false;
          }
          else {
LAB_0013e8aa:
            if ((local_2c8.status.val & 4) == 0) {
              MVar18 = _mpp_port_poll("try_get_enc_task",enc->output,MPP_POLL_NON_BLOCK);
              if (MVar18 < MPP_OK) {
                local_31c = local_31c | 8;
                goto LAB_0013e921;
              }
              local_2c8.status.val = local_2c8.status.val | 4;
              local_31c = local_31c & 0xfff7;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task out ready\n","try_get_enc_task");
              }
            }
            if ((local_2c8.status.val & 8) == 0) {
              _mpp_port_dequeue("try_get_enc_task",enc->input,local_2f8);
              if (enc->task_in == (MppTask)0x0) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x85b);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->task_in",
                           "try_get_enc_task",in_stack_fffffffffffffcb8);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
              }
              MVar18 = _mpp_port_dequeue("try_get_enc_task",enc->output,local_60);
              if (enc->task_out == (MppTask)0x0) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x85e);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->task_out",
                           "try_get_enc_task",in_stack_fffffffffffffcb8);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
              }
              ppvVar14 = local_2d0;
              ppvVar13 = local_2f8;
              mpp_task_meta_get_frame(*local_2f8,KEY_INPUT_FRAME,local_2d0);
              packet = local_68;
              mpp_task_meta_get_packet(*ppvVar13,KEY_OUTPUT_PACKET,local_68);
              mpp_task_meta_get_buffer(*ppvVar13,KEY_MOTION_INFO,local_70);
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task dequeue done frm %p pkt %p\n","try_get_enc_task",
                           *ppvVar14,*packet);
              }
              stopwatch = mpp_frame_get_stopwatch(*ppvVar14);
              mpp_stopwatch_record(stopwatch,"encode task start");
              *local_2e0 = (MppBuffer)0x0;
              local_2e0[1] = (MppBuffer)0x0;
              if (*packet == (MppPacket)0x0) {
                mpp_packet_new(packet);
              }
              else {
                pvVar21 = mpp_packet_get_buffer(*packet);
                enc->pkt_buf = pvVar21;
              }
              if (*local_2d0 != (MppFrame)0x0) {
                RVar20 = mpp_frame_get_pts(*local_2d0);
                pvVar21 = mpp_frame_get_buffer(enc->frame);
                enc->task_pts = RVar20;
                enc->frm_buf = pvVar21;
                mpp_packet_set_pts(enc->packet,RVar20);
                pvVar31 = enc->packet;
                RVar20 = mpp_frame_get_dts(enc->frame);
                mpp_packet_set_dts(pvVar31,RVar20);
                RVar19 = mpp_frame_get_eos(enc->frame);
                if (RVar19 == 0) {
                  mpp_packet_clr_eos(enc->packet);
                }
                else {
                  mpp_packet_set_eos(enc->packet);
                }
              }
              if ((*local_2d0 != (MppFrame)0x0) && (*local_2e0 != (MppBuffer)0x0)) {
                local_2c8.status.val = local_2c8.status.val | 8;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task frame packet ready\n","try_get_enc_task");
                }
                goto LAB_0013eadc;
              }
              mpp_stopwatch_record(stopwatch,"invalid on check frm pkt");
              memset(&local_2c8.task,0,0xb8);
              MVar18 = MPP_NOK;
            }
            else {
              stopwatch = (MppStopwatch)0x0;
LAB_0013eadc:
              uVar30 = local_2c8.seq_idx;
              if ((local_2c8.status.val & 0x10) == 0) {
                memset(&local_2c8.task,0,0x208);
                RVar6 = local_78->force_idr;
                RVar7 = local_78->force_pskip;
                RVar8 = local_78->force_nonref;
                RVar9 = local_78->force_lt_idx;
                RVar10 = local_78->force_temporal_id;
                MVar11 = local_78->force_ref_mode;
                RVar12 = local_78->force_ref_arg;
                local_2e8->force_flag = local_78->force_flag;
                local_2e8->force_idr = RVar6;
                local_2e8->force_pskip = RVar7;
                local_2e8->force_nonref = RVar8;
                local_2e8->force_lt_idx = RVar9;
                local_2e8->force_temporal_id = RVar10;
                local_2e8->force_ref_mode = MVar11;
                local_2e8->force_ref_arg = RVar12;
                (enc->frm_cfg).force_flag = 0;
                local_2c8.task.rc_task = &local_2c8.rc;
                local_2c8.task.frm_cfg = local_2e8;
                local_2c8.task.frame = enc->frame;
                local_2c8.task.input = enc->frm_buf;
                local_2c8.task.packet = enc->packet;
                local_2c8.task.output = enc->pkt_buf;
                local_2c8.task.md_info = enc->md_info;
                local_2c8.rc.frm.val._6_2_ = (short)local_2c8.seq_idx;
                local_2c8.rc.frame = enc->frame;
                uVar30 = local_2c8.seq_idx + 1U;
                local_2c8.task.stopwatch = stopwatch;
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  uVar30 = local_2c8.seq_idx & 0xffff;
                  local_2c8.seq_idx = local_2c8.seq_idx + 1U;
                  _mpp_log_l(4,"mpp_enc","task seq idx %d start\n","try_get_enc_task",(ulong)uVar30)
                  ;
                  uVar30 = local_2c8.seq_idx;
                }
              }
              local_2c8.seq_idx = uVar30;
              if ((local_2c8.status.val & 0x20) == 0) {
                MVar18 = rc_frm_check_drop(enc->rc_ctx,&local_2c8.rc);
                if (MVar18 == MPP_OK) {
                  local_2c8.status.val = local_2c8.status.val | 0x20;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d drop %d\n","try_get_enc_task",
                               local_2c8.rc.frm.val >> 0x30,
                               (ulong)((uint)((ulong)local_2c8.rc.frm >> 0x20) & 1));
                  }
                  local_2c8.task.valid = 1;
                  MVar18 = MPP_OK;
                  if ((local_2c8.rc.frm.val & 0x100000000) == 0) goto LAB_0013edae;
                  mpp_stopwatch_record(stopwatch,"invalid on frame rate drop");
                  local_2c8.task.length = 0;
                  local_2c8.task.flags.drop_by_fps = 1;
                  EVar26.val = local_2c8.status.val | 0x100;
                  MVar18 = MPP_OK;
                  uVar30 = local_2c8.status.val >> 9;
                  local_2c8.status.val = EVar26.val;
                  if ((uVar30 & 1) == 0) {
                    if (local_2c8.usr.force_flag != 0) {
                      mpp_enc_refs_set_usr_cfg(enc->refs,local_2e8);
                    }
                    local_2c8.status.val = local_2c8.status.val | 0x200;
                  }
                }
                else {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                  _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_check_drop:%-4d failed return %d",
                             (char *)0x0,enc->mpp,0x88f,in_stack_fffffffffffffcb8);
                  MVar18 = MPP_NOK;
                }
              }
              else {
LAB_0013edae:
                if (local_2c8.task.valid == 0) {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8a6);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "hal_task->valid","try_get_enc_task",in_stack_fffffffffffffcb8);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
                }
                if ((local_2c8.status.val & 0x80) == 0) {
                  MVar33 = (MppPskipMode)enc->pkt_buf;
                  if (MVar33 == (MppPskipMode)0x0) {
                    uVar25 = ((enc->cfg).prep.height + 0xfU & 0xffffff0) *
                             ((enc->cfg).prep.width + 0xfU & 0xfffffff0);
                    uVar30 = uVar25 * 3 >> 1;
                    if (enc->coding != MPP_VIDEO_CodingMJPEG) {
                      uVar30 = uVar25;
                    }
                    pvVar24 = enc->mpp;
                    pvVar31 = enc->packet;
                    local_310.pskip_is_ref = 0;
                    local_310.pskip_is_non_ref = 0;
                    if (uVar30 == 0) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x611);
                      _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"size",
                                 "mpp_enc_check_pkt_buf",in_stack_fffffffffffffcb8);
                      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
                    }
                    mpp_buffer_get_with_tag
                              (*(MppBufferGroup *)((long)pvVar24 + 0x38),(MppBuffer *)&local_310,
                               (ulong)uVar30,"mpp_enc","mpp_enc_check_pkt_buf");
                    mpp_buffer_attach_dev_f("mpp_enc_check_pkt_buf",(MppBuffer)local_310,enc->dev);
                    if (local_310 == (MppPskipMode)0x0) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x614);
                      _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"buffer",
                                 "mpp_enc_check_pkt_buf",in_stack_fffffffffffffcb8);
                      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
                    }
                    enc->pkt_buf = (MppBuffer)local_310;
                    pvVar24 = mpp_buffer_get_ptr_with_caller
                                        ((MppBuffer)local_310,"mpp_enc_check_pkt_buf");
                    *(void **)((long)pvVar31 + 8) = pvVar24;
                    *(void **)((long)pvVar31 + 0x10) = pvVar24;
                    sVar22 = mpp_buffer_get_size_with_caller
                                       ((MppBuffer)local_310,"mpp_enc_check_pkt_buf");
                    *(size_t *)((long)pvVar31 + 0x18) = sVar22;
                    *(undefined8 *)((long)pvVar31 + 0x20) = 0;
                    *(MppPskipMode *)((long)pvVar31 + 0x40) = local_310;
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      pvVar31 = enc->packet;
                      pcVar27 = "create output pkt %p buf %p\n";
                      MVar33 = local_310;
                      goto LAB_0013f06d;
                    }
                  }
                  else if (((byte)mpp_enc_debug & 0x20) != 0) {
                    pvVar31 = enc->packet;
                    in_stack_fffffffffffffcb8 = mpp_packet_get_pos(pvVar31);
                    in_stack_fffffffffffffcc0 = mpp_packet_get_length(enc->packet);
                    pcVar27 = "output to pkt %p buf %p pos %p length %d\n";
LAB_0013f06d:
                    _mpp_log_l(4,"mpp_enc",pcVar27,"mpp_enc_check_pkt_buf",pvVar31,MVar33);
                  }
                  local_2c8.status.val = local_2c8.status.val | 0x80;
                  local_2c8.task.output = enc->pkt_buf;
                }
                if (enc->packet == (MppPacket)0x0) {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8af);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->packet",
                             "try_get_enc_task",in_stack_fffffffffffffcb8);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
                }
                if (enc->pkt_buf == (MppBuffer)0x0) {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8b0);
                  _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->pkt_buf"
                             ,"try_get_enc_task",in_stack_fffffffffffffcb8);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
                }
                if (enc->hal_info_updated == 0) {
                  update_enc_hal_info(enc);
                  enc->hal_info_updated = 1;
                }
                if (((uint)enc->hdr_status & 1) == 0) {
                  enc_impl_gen_hdr(enc->impl,enc->hdr_pkt);
                  sVar22 = mpp_packet_get_length(enc->hdr_pkt);
                  enc->hdr_len = (RK_U32)sVar22;
                  *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 1;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d update header length %d\n","try_get_enc_task",
                               local_2c8.rc.frm.val >> 0x30,sVar22 & 0xffffffff);
                  }
                  mpp_packet_append(enc->packet,enc->hdr_pkt);
                  local_2c8.task.header_length = enc->hdr_len;
                  local_2c8.task.length = local_2c8.task.length + local_2c8.task.header_length;
                  *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 8;
                }
                check_hal_task_pkt_len(&local_2c8.task,"gen_hdr and adding");
                if ((local_2c8.status.val & 0x100) == 0) {
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d enc start\n","try_get_enc_task",
                               local_2c8.rc.frm.val >> 0x30);
                  }
                  MVar18 = enc_impl_start(enc->impl,&local_2c8.task);
                  if (MVar18 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    _mpp_log_l(2,"mpp_enc","mpp %p enc_impl_start:%-4d failed return %d",(char *)0x0
                               ,enc->mpp,0x8cd,in_stack_fffffffffffffcb8);
                    MVar18 = MPP_NOK;
                    goto LAB_0013f2c4;
                  }
                  local_2c8.status.val = local_2c8.status.val | 0x100;
                  MVar18 = MPP_OK;
                }
                if ((local_2c8.status.val & 0x200) == 0) {
                  if (local_2c8.usr.force_flag != 0) {
                    mpp_enc_refs_set_usr_cfg(enc->refs,local_2e8);
                  }
                  local_2c8.status.val = local_2c8.status.val | 0x200;
                }
                if ((local_2c8.status.val & 0x800) == 0) {
                  mpp_enc_refs_stash(enc->refs);
                  local_2c8.status.val = local_2c8.status.val | 0x800;
                }
              }
            }
LAB_0013f2c4:
            if (MVar18 == MPP_OK) {
              bVar36 = true;
            }
            else {
              mpp_stopwatch_record(local_2c8.task.stopwatch,"encode task done");
              if (enc->packet != (MppPacket)0x0) {
                mpp_packet_set_length(enc->packet,(ulong)local_2c8.task.length);
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n",
                             "mpp_enc_terminate_task",local_2c8.rc.frm.val >> 0x30,enc->task_pts);
                }
                mpp_task_meta_set_packet(enc->task_out,KEY_OUTPUT_PACKET,enc->packet);
                _mpp_port_enqueue("mpp_enc_terminate_task",enc->output,enc->task_out);
              }
              if (*local_2f8 != (MppTask)0x0) {
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","mpp_enc_terminate_task"
                             ,local_2c8.rc.frm.val >> 0x30,enc->task_pts);
                }
                mpp_task_meta_set_frame(enc->task_in,KEY_INPUT_FRAME,enc->frame);
                _mpp_port_enqueue("mpp_enc_terminate_task",enc->input,enc->task_in);
              }
              local_2f8[2] = (MppFrame)0x0;
              local_2f8[3] = (MppPacket)0x0;
              *local_2f8 = (MppTask)0x0;
              local_2f8[1] = (MppTask)0x0;
              *local_2e0 = (MppBuffer)0x0;
              local_2e0[1] = (MppBuffer)0x0;
              (enc->hdr_status).val = *(byte *)&enc->hdr_status & 1;
              local_2c8.status.val = 0;
              bVar36 = false;
            }
          }
          if (bVar36) goto LAB_0013e44a;
          goto LAB_0014115a;
        }
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","thread reset start\n","mpp_enc_thread");
        }
        __mutex = local_2f0;
        pthread_mutex_lock(local_2f0);
        enc->status_flag = 0;
        pthread_mutex_unlock(__mutex);
        *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
        pRVar1 = &(enc->frm_cfg).force_idr;
        *pRVar1 = *pRVar1 + 1;
        pthread_mutex_lock(local_90);
        enc->reset_flag = 0;
        sem_post(local_50);
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_thread");
        }
        pthread_mutex_unlock(local_90);
      }
      else {
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_thread",(ulong)enc->cmd_recv,
                     (ulong)enc->cmd);
        }
        sem_wait(local_40);
        MVar18 = mpp_enc_proc_cfg(enc,enc->cmd,enc->param);
        if (MVar18 != MPP_OK) {
          *enc->cmd_ret = MVar18;
        }
        uVar30 = enc->cmd_recv + 1;
        enc->cmd_recv = uVar30;
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_thread",(ulong)uVar30,
                     (ulong)enc->cmd_send);
        }
        enc->param = (void *)0x0;
        enc->cmd = 0;
        sem_post(local_48);
        mpp_enc_hal_prepare(enc->enc_hal);
        mpp_enc_proc_rc_update(enc);
      }
      local_31c = 0;
    }
    else {
LAB_0013e44a:
      if ((local_2c8.status.val & 0x100) == 0) {
        in_stack_fffffffffffffcb8 =
             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0xa89);
        _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"status->enc_start",
                   "mpp_enc_thread",in_stack_fffffffffffffcb8);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001411b1:
          abort();
        }
      }
      pvVar31 = local_2c8.task.packet;
      if ((local_2c8.status.val >> 8 & 1) != 0) {
        if (enc->low_delay_part_mode == 0) {
          bVar36 = true;
          if (local_2c8.task.flags.drop_by_fps == 0) {
            mpp = (Mpp *)enc->mpp;
            pMVar3 = (MppEncImpl *)mpp->mEnc;
            pvVar4 = pMVar3->impl;
            local_88 = pMVar3->enc_hal;
            local_300 = local_2c8.task.packet;
            if (((pMVar3->support_hw_deflicker == 0) || ((pMVar3->cfg).rc.debreath_en == 0)) ||
               (MVar18 = mpp_enc_proc_two_pass(mpp,&local_2c8), MVar18 == MPP_OK)) {
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d check force pskip start\n","mpp_enc_normal",
                           local_2c8.rc.frm.val >> 0x30);
              }
              if ((local_2c8.status.val & 0x40) == 0) {
                local_2c8.status.val = local_2c8.status.val | 0x40;
                mpp_enc_get_pskip_mode((Mpp *)pMVar3->mpp,&local_2c8,&local_310);
                bVar36 = true;
                MVar18 = MPP_OK;
                if (local_310.pskip_is_non_ref != 0 || local_310.pskip_is_ref != 0) {
                  MVar18 = mpp_enc_force_pskip((Mpp *)pMVar3->mpp,&local_2c8);
                  if (MVar18 == MPP_OK) {
                    MVar18 = MPP_OK;
                    bVar36 = false;
                  }
                  else if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","mpp_enc_normal",
                               local_2c8.rc.frm.val >> 0x30);
                  }
                }
                pvVar31 = local_300;
                if (!bVar36) goto LAB_0013fce6;
              }
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","mpp_enc_normal",
                           local_2c8.rc.frm.val >> 0x30);
              }
              mpp_enc_refs_get_cpb(pMVar3->refs,&local_2c8.rc.cpb);
              pvVar24 = local_88;
              if ((mpp_enc_debug._2_1_ & 1) != 0) {
                _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                           "mpp_enc_normal",(ulong)(ushort)local_2c8.rc.cpb.curr.val._6_2_);
              }
              MVar18 = enc_impl_proc_dpb(pvVar4,&local_2c8.task);
              if (MVar18 == MPP_OK) {
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","frm %d compare\n","mpp_enc_normal",
                             (ulong)(ushort)local_2c8.rc.cpb.curr.val._6_2_);
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","seq_idx      %d vs %d\n","mpp_enc_normal",
                             local_2c8.rc.frm.val >> 0x30,
                             (ulong)(ushort)local_2c8.rc.cpb.curr.val._6_2_);
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","is_idr       %d vs %d\n","mpp_enc_normal",
                             (ulong)((uint)local_2c8.rc.frm.val._0_4_ >> 5 & 1),
                             (ulong)((uint)local_2c8.rc.cpb.curr.val._0_4_ >> 5 & 1));
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","is_intra     %d vs %d\n","mpp_enc_normal",
                             (ulong)((uint)local_2c8.rc.frm.val._0_4_ >> 4 & 1),
                             (ulong)((uint)local_2c8.rc.cpb.curr.val._0_4_ >> 4 & 1));
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","is_non_ref   %d vs %d\n","mpp_enc_normal",
                             (ulong)((uint)local_2c8.rc.frm.val._0_4_ >> 6 & 1),
                             (ulong)((uint)local_2c8.rc.cpb.curr.val._0_4_ >> 6 & 1));
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","is_lt_ref    %d vs %d\n","mpp_enc_normal",
                             (ulong)((uint)local_2c8.rc.frm.val._0_4_ >> 7 & 1),
                             (ulong)((uint)local_2c8.rc.cpb.curr.val._0_4_ >> 7 & 1));
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","lt_idx       %d vs %d\n","mpp_enc_normal",
                             (ulong)((uint)local_2c8.rc.frm.val._0_4_ >> 8 & 0xf),
                             (ulong)((uint)local_2c8.rc.cpb.curr.val._0_4_ >> 8 & 0xf));
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","temporal_id  %d vs %d\n","mpp_enc_normal",
                             (ulong)((uint)local_2c8.rc.frm.val._0_4_ >> 0xc & 0xf),
                             (ulong)((uint)local_2c8.rc.cpb.curr.val._0_4_ >> 0xc & 0xf));
                }
                if ((mpp_enc_debug._2_1_ & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","frm %d done  ***********************************\n",
                             "mpp_enc_normal",(ulong)(ushort)local_2c8.rc.cpb.curr.val._6_2_);
                }
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","mpp_enc_normal",
                             local_2c8.rc.frm.val >> 0x30);
                }
                MVar18 = rc_frm_start(pMVar3->rc_ctx,&local_2c8.rc);
                if (MVar18 == MPP_OK) {
                  mpp_enc_add_sw_header(pMVar3,&local_2c8.task);
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_normal",
                               local_2c8.rc.frm.val >> 0x30);
                  }
                  MVar18 = enc_impl_proc_hal(pvVar4,&local_2c8.task);
                  if (MVar18 == MPP_OK) {
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_normal",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = mpp_enc_hal_get_task(pvVar24,&local_2c8.task);
                    if (MVar18 == MPP_OK) {
                      if (((byte)mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","mpp_enc_normal",
                                   local_2c8.rc.frm.val >> 0x30);
                      }
                      MVar18 = rc_hal_start(pMVar3->rc_ctx,&local_2c8.rc);
                      if (MVar18 == MPP_OK) {
                        if (((byte)mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_normal",
                                     local_2c8.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_gen_regs(pvVar24,&local_2c8.task);
                        if (MVar18 == MPP_OK) {
                          local_2c8.task.segment_nb =
                               mpp_packet_get_segment_nb(local_2c8.task.packet);
                          mpp_stopwatch_record(local_2c8.task.stopwatch,"encode hal start");
                          if (((byte)mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_normal",
                                       local_2c8.rc.frm.val >> 0x30);
                          }
                          MVar18 = mpp_enc_hal_start(pvVar24,&local_2c8.task);
                          if (MVar18 == MPP_OK) {
                            if (((byte)mpp_enc_debug & 0x20) != 0) {
                              _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_normal",
                                         local_2c8.rc.frm.val >> 0x30);
                            }
                            MVar18 = mpp_enc_hal_wait(pvVar24,&local_2c8.task);
                            if (MVar18 == MPP_OK) {
                              mpp_stopwatch_record(local_2c8.task.stopwatch,"encode hal finish");
                              if (((byte)mpp_enc_debug & 0x20) != 0) {
                                _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","mpp_enc_normal",
                                           local_2c8.rc.frm.val >> 0x30);
                              }
                              MVar18 = rc_hal_end(pMVar3->rc_ctx,&local_2c8.rc);
                              if (MVar18 == MPP_OK) {
                                if (((byte)mpp_enc_debug & 0x20) != 0) {
                                  _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_normal",
                                             local_2c8.rc.frm.val >> 0x30);
                                }
                                MVar18 = mpp_enc_hal_ret_task(local_88,&local_2c8.task);
                                if (MVar18 == MPP_OK) {
                                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                                    _mpp_log_l(4,"mpp_enc","task %d rc frame check reenc\n",
                                               "mpp_enc_normal",local_2c8.rc.frm.val >> 0x30);
                                  }
                                  MVar18 = rc_frm_check_reenc(pMVar3->rc_ctx,&local_2c8.rc);
                                  if (MVar18 == MPP_OK) {
                                    MVar18 = MPP_OK;
                                    pvVar31 = local_300;
                                    goto LAB_0013fce6;
                                  }
                                  in_stack_fffffffffffffcb8 =
                                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >>
                                                             0x20),MVar18);
                                  pcVar27 = "mpp %p rc_frm_check_reenc:%-4d failed return %d";
                                  uVar32 = 0x78d;
                                }
                                else {
                                  in_stack_fffffffffffffcb8 =
                                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >>
                                                             0x20),MVar18);
                                  pcVar27 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                                  uVar32 = 0x78a;
                                }
                              }
                              else {
                                in_stack_fffffffffffffcb8 =
                                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20
                                                           ),MVar18);
                                pcVar27 = "mpp %p rc_hal_end:%-4d failed return %d";
                                uVar32 = 0x787;
                              }
                              _mpp_log_l(2,"mpp_enc",pcVar27,(char *)0x0,mpp,uVar32,
                                         in_stack_fffffffffffffcb8);
                              pvVar31 = local_300;
                              goto LAB_0013fce6;
                            }
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  MVar18);
                            pcVar27 = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
                            uVar32 = 0x782;
                          }
                          else {
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  MVar18);
                            pcVar27 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                            uVar32 = 0x77f;
                          }
                        }
                        else {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar27 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                          uVar32 = 0x77a;
                        }
                      }
                      else {
                        in_stack_fffffffffffffcb8 =
                             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18
                                             );
                        pcVar27 = "mpp %p rc_hal_start:%-4d failed return %d";
                        uVar32 = 0x777;
                      }
                    }
                    else {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                      uVar32 = 0x774;
                    }
                  }
                  else {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    pcVar27 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                    uVar32 = 0x771;
                  }
                }
                else {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                  pcVar27 = "mpp %p rc_frm_start:%-4d failed return %d";
                  uVar32 = 0x76b;
                }
              }
              else {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                pcVar27 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
                uVar32 = 0x75e;
              }
              _mpp_log_l(2,"mpp_enc",pcVar27,(char *)0x0,mpp,uVar32,in_stack_fffffffffffffcb8);
            }
LAB_0013fce6:
            if (MVar18 == MPP_OK) {
              bVar36 = true;
              if ((local_2c8.rc.frm.val >> 0x22 & 1) != 0) {
                while ((uint)(byte)((ulong)local_2c8.rc.frm >> 0x28) < (enc->cfg).rc.max_reenc_times
                      ) {
                  local_2c8.task.length = local_2c8.task.length - local_2c8.task.hw_length;
                  local_2c8.task.hw_length = 0;
                  mpp_packet_set_segment_nb(local_2c8.task.packet,local_2c8.task.segment_nb);
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    uVar30 = (uint)((ulong)local_2c8.rc.frm >> 0x20);
                    in_stack_fffffffffffffcb8 =
                         (void *)(CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                           uVar30 >> 8) & 0xffffffff000000ff);
                    _mpp_log_l(4,"mpp_enc","task %d reenc %d times %d\n","try_proc_normal_task",
                               local_2c8.rc.frm.val >> 0x30,(ulong)(uVar30 >> 2 & 1),
                               in_stack_fffffffffffffcb8);
                  }
                  if ((local_2c8.rc.frm.val & 0x100000000) != 0) {
                    pvVar5 = mpp->mEnc;
                    if (((byte)mpp_enc_debug & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_drop");
                    }
                    mpp_enc_refs_rollback(*(MppEncRefs *)((long)pvVar5 + 0x210));
                    local_2c8.rc.info.bit_real = local_2c8.task.length;
                    local_2c8.rc.info.quality_real = local_2c8.rc.info.quality_target;
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","mpp_enc_reenc_drop",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = rc_frm_end(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c8.rc);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",(char *)0x0,
                                 mpp,0x7e2,in_stack_fffffffffffffcb8);
                    }
                    pcVar27 = "mpp_enc_reenc_drop";
                    pvVar31 = local_300;
joined_r0x00140664:
                    if (((byte)mpp_enc_debug & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","leave\n",pcVar27);
                    }
                    break;
                  }
                  if ((local_2c8.rc.frm.val & 0x10000000a0) == 0x1000000000) {
                    pvVar5 = mpp->mEnc;
                    pvVar4 = *(EncImpl *)((long)pvVar5 + 8);
                    if (((byte)mpp_enc_debug & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_force_pskip");
                    }
                    local_2c8.usr.force_pskip = local_2c8.usr.force_pskip + 1;
                    local_2c8.usr.force_flag = local_2c8.usr.force_flag | 0x40;
                    mpp_enc_refs_rollback(*(MppEncRefs *)((long)pvVar5 + 0x210));
                    mpp_enc_refs_set_usr_cfg(*(MppEncRefs *)((long)pvVar5 + 0x210),local_2e8);
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","mpp_enc_reenc_force_pskip",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    mpp_enc_refs_get_cpb(*(MppEncRefs *)((long)pvVar5 + 0x210),&local_2c8.rc.cpb);
                    if ((mpp_enc_debug._2_1_ & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                                 "mpp_enc_reenc_force_pskip",
                                 (ulong)(ushort)local_2c8.rc.cpb.curr.val._6_2_);
                    }
                    MVar18 = enc_impl_proc_dpb(pvVar4,&local_2c8.task);
                    if (MVar18 == MPP_OK) {
                      if (((byte)mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d enc sw enc start\n",
                                   "mpp_enc_reenc_force_pskip",local_2c8.rc.frm.val >> 0x30);
                      }
                      MVar18 = enc_impl_sw_enc(pvVar4,&local_2c8.task);
                      if (MVar18 != MPP_OK) {
                        in_stack_fffffffffffffcb8 =
                             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18
                                             );
                        pcVar27 = "mpp %p enc_impl_sw_enc:%-4d failed return %d";
                        uVar32 = 0x805;
                        goto LAB_001407ea;
                      }
                      if (((byte)mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","mpp_enc_reenc_force_pskip",
                                   local_2c8.rc.frm.val >> 0x30);
                      }
                      MVar18 = rc_frm_end(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c8.rc);
                      if (MVar18 != MPP_OK) {
                        in_stack_fffffffffffffcb8 =
                             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18
                                             );
                        _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",(char *)0x0
                                   ,mpp,0x808,in_stack_fffffffffffffcb8);
                      }
                    }
                    else {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
                      uVar32 = 0x802;
LAB_001407ea:
                      _mpp_log_l(2,"mpp_enc",pcVar27,(char *)0x0,mpp,uVar32,
                                 in_stack_fffffffffffffcb8);
                    }
                    pcVar27 = "mpp_enc_reenc_force_pskip";
                    goto joined_r0x00140664;
                  }
                  local_2c8.rc.frm.val = local_2c8.rc.frm.val & 0xffffffeeffffffff;
                  pvVar5 = mpp->mEnc;
                  pvVar24 = *(void **)((long)pvVar5 + 0x10);
                  if (((byte)mpp_enc_debug & 1) != 0) {
                    _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_simple");
                  }
                  local_88 = (MppEncHal)
                             CONCAT44(local_2c8.rc.info.bit_min,local_2c8.rc.info.bit_max);
                  uStack_80 = CONCAT44(local_2c8.rc.info.quality_max,
                                       local_2c8.rc.info.quality_target);
                  memset(&local_2c8.rc.info,0,0x88);
                  local_2c8.rc.info.bit_max = (RK_S32)local_88;
                  local_2c8.rc.info.bit_min = local_88._4_4_;
                  local_2c8.rc.info.quality_target = (RK_S32)uStack_80;
                  local_2c8.rc.info.quality_max = uStack_80._4_4_;
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_reenc_simple",
                               local_2c8.rc.frm.val >> 0x30);
                  }
                  MVar18 = enc_impl_proc_hal(*(EncImpl *)((long)pvVar5 + 8),&local_2c8.task);
                  pvVar31 = local_300;
                  if (MVar18 == MPP_OK) {
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = mpp_enc_hal_get_task(pvVar24,&local_2c8.task);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                      uVar32 = 0x7b4;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = rc_hal_start(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c8.rc);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p rc_hal_start:%-4d failed return %d";
                      uVar32 = 0x7b7;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = mpp_enc_hal_gen_regs(pvVar24,&local_2c8.task);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                      uVar32 = 0x7ba;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = mpp_enc_hal_start(pvVar24,&local_2c8.task);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                      uVar32 = 0x7bd;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = mpp_enc_hal_wait(pvVar24,&local_2c8.task);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
                      uVar32 = 0x7c0;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = rc_hal_end(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c8.rc);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p rc_hal_end:%-4d failed return %d";
                      uVar32 = 0x7c3;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = mpp_enc_hal_ret_task(pvVar24,&local_2c8.task);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar27 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                      uVar32 = 0x7c6;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc frame check reenc\n","mpp_enc_reenc_simple"
                                 ,local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = rc_frm_check_reenc(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c8.rc);
                    uVar28 = (undefined4)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
                    if (MVar18 != MPP_OK) {
                      in_stack_fffffffffffffcb8 = (void *)CONCAT44(uVar28,MVar18);
                      pcVar27 = "mpp %p rc_frm_check_reenc:%-4d failed return %d";
                      uVar32 = 0x7c9;
                      goto LAB_001402f3;
                    }
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      uVar30 = (uint)((ulong)local_2c8.rc.frm >> 0x20);
                      in_stack_fffffffffffffcb8 =
                           (void *)(CONCAT44(uVar28,uVar30 >> 8) & 0xffffffff000000ff);
                      _mpp_log_l(4,"mpp_enc","task %d reenc %d times %d\n","mpp_enc_reenc_simple",
                                 local_2c8.rc.frm.val >> 0x30,(ulong)(uVar30 >> 2 & 1),
                                 in_stack_fffffffffffffcb8);
                    }
                    if (((byte)mpp_enc_debug & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","leave\n","mpp_enc_reenc_simple");
                    }
                  }
                  else {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    pcVar27 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                    uVar32 = 0x7b1;
LAB_001402f3:
                    _mpp_log_l(2,"mpp_enc",pcVar27,(char *)0x0,mpp,uVar32,in_stack_fffffffffffffcb8)
                    ;
                  }
                  if ((local_2c8.rc.frm.val & 0x400000000) == 0) break;
                }
              }
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","try_proc_normal_task",
                           local_2c8.rc.frm.val >> 0x30);
              }
              MVar18 = rc_frm_end(enc->rc_ctx,&local_2c8.rc);
              if (MVar18 == MPP_OK) {
                RVar20 = mpp_time();
                enc->time_end = RVar20;
                enc->frame_count = enc->frame_count + 1;
                if (((enc->dev != (MppDev)0x0) && (enc->time_base != 0)) &&
                   ((RVar20 != 0 && (999999 < RVar20 - enc->time_base)))) {
                  update_hal_info_fps(enc);
                }
                local_2c8.rc.frm.val = local_2c8.rc.frm.val & 0xffff00fbffffffff;
                local_2c8.usr.force_flag = 0;
              }
              else {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                bVar36 = false;
                _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",(char *)0x0,mpp,
                           0xa09,in_stack_fffffffffffffcb8);
              }
            }
            else {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
              bVar36 = false;
              _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_normal:%-4d failed return %d",(char *)0x0,mpp,
                         0x9f1,in_stack_fffffffffffffcb8);
            }
          }
          mpp_stopwatch_record(local_2c8.task.stopwatch,"encode task done");
          RVar19 = mpp_packet_is_partition(pvVar31);
          if (RVar19 == 0) {
            mpp_packet_set_length(pvVar31,(ulong)local_2c8.task.length);
          }
          if (bVar36) {
            set_enc_info_to_packet(enc,&local_2c8.task);
          }
          else {
            *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
            (enc->hdr_status).val = 0;
            mpp_packet_set_length(pvVar31,0);
            _mpp_log_l(2,"mpp_enc","enc failed force idr!\n","try_proc_normal_task");
          }
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n","try_proc_normal_task",
                       local_2c8.rc.frm.val >> 0x30,enc->task_pts);
          }
          mpp_task_meta_set_packet(enc->task_out,KEY_OUTPUT_PACKET,pvVar31);
          _mpp_port_enqueue("try_proc_normal_task",enc->output,enc->task_out);
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","try_proc_normal_task",
                       local_2c8.rc.frm.val >> 0x30,enc->task_pts);
          }
          mpp_task_meta_set_frame(enc->task_in,KEY_INPUT_FRAME,enc->frame);
          _mpp_port_enqueue("try_proc_normal_task",enc->input,enc->task_in);
          if ((enc->support_hw_deflicker != 0) && ((enc->cfg).rc.debreath_en != 0)) {
            memcpy(local_58,&local_2c8.rc.info,0x88);
          }
          local_2f8[2] = (MppFrame)0x0;
          local_2f8[3] = (MppPacket)0x0;
          *local_2f8 = (MppTask)0x0;
          local_2f8[1] = (MppTask)0x0;
          *local_2e0 = (MppBuffer)0x0;
          local_2e0[1] = (MppBuffer)0x0;
          (enc->hdr_status).val = *(byte *)&enc->hdr_status & 1;
          local_2c8.status.val = 0;
        }
        else {
          pMVar3 = *(MppEncImpl **)((long)local_308 + 0xb0);
          if (local_2c8.task.flags.drop_by_fps != 0) goto LAB_00140e70;
          pvVar24 = pMVar3->enc_hal;
          if ((local_2c8.status.val >> 10 & 1) != 0) goto LAB_00140bca;
          pvVar4 = pMVar3->impl;
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d check force pskip start\n","try_proc_low_deley_task",
                       local_2c8.rc.frm.val >> 0x30);
          }
          if ((local_2c8.status.val & 0x40) == 0) {
            local_2c8.status.val = local_2c8.status.val | 0x40;
            mpp_enc_get_pskip_mode((Mpp *)pMVar3->mpp,&local_2c8,&local_310);
            if (local_310.pskip_is_non_ref != 0 || local_310.pskip_is_ref != 0) {
              MVar18 = mpp_enc_force_pskip((Mpp *)pMVar3->mpp,&local_2c8);
              if (MVar18 == MPP_OK) goto LAB_00140e70;
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","try_proc_low_deley_task",
                           local_2c8.rc.frm.val >> 0x30);
              }
            }
          }
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","try_proc_low_deley_task",
                       local_2c8.rc.frm.val >> 0x30);
          }
          mpp_enc_refs_get_cpb(pMVar3->refs,&local_2c8.rc.cpb);
          if ((mpp_enc_debug._2_1_ & 1) != 0) {
            _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                       "try_proc_low_deley_task",(ulong)(ushort)local_2c8.rc.cpb.curr.val._6_2_);
          }
          MVar18 = enc_impl_proc_dpb(pvVar4,&local_2c8.task);
          if (MVar18 == MPP_OK) {
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","try_proc_low_deley_task",
                         local_2c8.rc.frm.val >> 0x30);
            }
            MVar18 = rc_frm_start(pMVar3->rc_ctx,&local_2c8.rc);
            if (MVar18 == MPP_OK) {
              mpp_enc_add_sw_header(pMVar3,&local_2c8.task);
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","try_proc_low_deley_task",
                           local_2c8.rc.frm.val >> 0x30);
              }
              MVar18 = enc_impl_proc_hal(pvVar4,&local_2c8.task);
              if (MVar18 == MPP_OK) {
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d hal get task\n","try_proc_low_deley_task",
                             local_2c8.rc.frm.val >> 0x30);
                }
                MVar18 = mpp_enc_hal_get_task(pvVar24,&local_2c8.task);
                if (MVar18 == MPP_OK) {
                  if (((byte)mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","try_proc_low_deley_task",
                               local_2c8.rc.frm.val >> 0x30);
                  }
                  MVar18 = rc_hal_start(pMVar3->rc_ctx,&local_2c8.rc);
                  if (MVar18 == MPP_OK) {
                    if (((byte)mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","try_proc_low_deley_task",
                                 local_2c8.rc.frm.val >> 0x30);
                    }
                    MVar18 = mpp_enc_hal_gen_regs(pvVar24,&local_2c8.task);
                    if (MVar18 == MPP_OK) {
                      local_2c8.task.part_first = 0;
                      local_2c8.task.part_last = 0;
                      do {
                        if (((byte)mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal start\n","try_proc_low_deley_task",
                                     local_2c8.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_part_start(pvVar24,&local_2c8.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar27 = "mpp %p mpp_enc_hal_part_start:%-4d failed return %d";
                          uVar32 = 0x924;
                          goto LAB_001410a6;
                        }
                        if (((byte)mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal wait\n","try_proc_low_deley_task",
                                     local_2c8.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_part_wait(pvVar24,&local_2c8.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar27 = "mpp %p mpp_enc_hal_part_wait:%-4d failed return %d";
                          uVar32 = 0x927;
                          goto LAB_001410a6;
                        }
                        if (((byte)mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","try_proc_low_deley_task",
                                     local_2c8.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_ret_task(pvVar24,&local_2c8.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar27 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                          uVar32 = 0x92a;
                          goto LAB_001410a6;
                        }
                        if (local_2c8.task.part_first != 0) {
                          local_2c8.task.part_pos = (RK_U8 *)mpp_packet_get_pos(pvVar31);
                          local_2c8.task.part_length = 0;
                        }
                        mpp_packet_set_length(pvVar31,(ulong)local_2c8.task.length);
                        if (((byte)mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d task_out %p\n","try_proc_low_deley_task",
                                     local_2c8.rc.frm.val >> 0x30,pMVar3->task_out);
                        }
LAB_00140bca:
                        if (pMVar3->task_out == (MppTask)0x0) {
                          if (((byte)mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task %d poll new task for part output\n",
                                       "try_proc_low_deley_task",local_2c8.rc.frm.val >> 0x30);
                          }
                          MVar18 = _mpp_port_poll("try_proc_low_deley_task",pMVar3->output,
                                                  MPP_POLL_NON_BLOCK);
                          if (MVar18 < MPP_OK) goto LAB_00140e5e;
                          local_2c8.status.val = local_2c8.status.val | 4;
                          local_31c = local_31c & 0xfff7;
                          if (((byte)mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task out ready\n","try_proc_low_deley_task");
                          }
                          _mpp_port_dequeue("try_proc_low_deley_task",pMVar3->output,
                                            &pMVar3->task_out);
                        }
                        if (pMVar3->task_out == (MppTask)0x0) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                0x947);
                          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                                     "enc->task_out","try_proc_low_deley_task",
                                     in_stack_fffffffffffffcb8);
                          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001411b1;
                        }
                        if (local_2c8.task.part_last == 0) {
                          pvVar23 = mpp_packet_get_pos(pvVar31);
                          pRVar15 = local_2c8.task.part_pos;
                          uVar29 = (ulong)local_2c8.task.length;
                          local_310.pskip_is_ref = 0;
                          local_310.pskip_is_non_ref = 0;
                          if (((byte)mpp_enc_debug & 0x20) != 0) {
                            in_stack_fffffffffffffcc0 =
                                 CONCAT44((int)(in_stack_fffffffffffffcc0 >> 0x20),
                                          local_2c8.task.length);
                            in_stack_fffffffffffffcb8 = pvVar23;
                            _mpp_log_l(4,"mpp_enc","pkt %d last %p part %p len %d\n",
                                       "try_proc_low_deley_task",(ulong)local_2c8.task.part_count,
                                       local_2c8.task.part_pos,pvVar23,in_stack_fffffffffffffcc0);
                          }
                          pRVar34 = (RK_U8 *)((long)pvVar23 + uVar29);
                          mpp_packet_copy_init((MppPacket *)&local_310,pvVar31);
                          *(RK_U8 **)((long)local_310 + 0x10) = pRVar15;
                          *(ulong *)((long)local_310 + 0x20) =
                               (long)pRVar34 - (long)pRVar15 & 0xffffffff;
                          *(undefined4 *)((long)local_310 + 0x38) = 0;
                          *(undefined1 *)((long)local_310 + 0x38) = 0x10;
                          bVar16 = ((byte)local_2c8.task.part_first & 1) << 5 | 0x10;
                          *(byte *)((long)local_310 + 0x38) = bVar16;
                          *(byte *)((long)local_310 + 0x38) =
                               ((byte)local_2c8.task.part_last & 1) << 6 | bVar16;
                          if (((byte)mpp_enc_debug & 0x20) != 0) {
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  (int)((long)pRVar34 - (long)pRVar15));
                            _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n",
                                       "try_proc_low_deley_task",(ulong)local_2c8.task.part_count,
                                       pRVar15,in_stack_fffffffffffffcb8);
                          }
                          local_2c8.task.part_pos = pRVar34;
                          if (((byte)mpp_enc_debug & 0x20) != 0) {
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  local_2c8.task.part_count);
                            _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld part %d\n",
                                       "try_proc_low_deley_task",local_2c8.rc.frm.val >> 0x30,
                                       pMVar3->task_pts,in_stack_fffffffffffffcb8);
                          }
                          mpp_task_meta_set_packet
                                    (pMVar3->task_out,KEY_OUTPUT_PACKET,(MppPacket)local_310);
                          _mpp_port_enqueue("try_proc_low_deley_task",pMVar3->output,
                                            pMVar3->task_out);
                          pMVar3->task_out = (MppTask)0x0;
                          local_2c8.task.part_count = local_2c8.task.part_count + 1;
                        }
                        if (local_2c8.task.part_last != 0) goto LAB_00140e70;
                      } while( true );
                    }
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    pcVar27 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                    uVar32 = 0x91d;
                  }
                  else {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    pcVar27 = "mpp %p rc_hal_start:%-4d failed return %d";
                    uVar32 = 0x91a;
                  }
                }
                else {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                  pcVar27 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                  uVar32 = 0x917;
                }
              }
              else {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                pcVar27 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                uVar32 = 0x914;
              }
            }
            else {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
              pcVar27 = "mpp %p rc_frm_start:%-4d failed return %d";
              uVar32 = 0x90e;
            }
          }
          else {
            in_stack_fffffffffffffcb8 =
                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
            pcVar27 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
            uVar32 = 0x90b;
          }
LAB_001410a6:
          while( true ) {
            _mpp_log_l(2,"mpp_enc",pcVar27,(char *)0x0,local_308,uVar32,in_stack_fffffffffffffcb8);
LAB_00140e70:
            pvVar24 = mpp_packet_get_pos(pvVar31);
            pRVar15 = local_2c8.task.part_pos;
            uVar29 = (ulong)local_2c8.task.length;
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              in_stack_fffffffffffffcb8 = pvVar24;
              in_stack_fffffffffffffcc0 = uVar29;
              _mpp_log_l(4,"mpp_enc","pkt %d last %p part %p len %d\n","try_proc_low_deley_task",
                         (ulong)local_2c8.task.part_count,local_2c8.task.part_pos,pvVar24,uVar29);
            }
            pRVar34 = (RK_U8 *)((long)pvVar24 + uVar29);
            uVar28 = (undefined4)((long)pRVar34 - (long)pRVar15);
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),uVar28);
              _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n","try_proc_low_deley_task",
                         (ulong)local_2c8.task.part_count,pRVar15,in_stack_fffffffffffffcb8);
            }
            *(ulong *)((long)pvVar31 + 0x20) = (long)pRVar34 - (long)pRVar15 & 0xffffffff;
            *(RK_U8 **)((long)pvVar31 + 0x10) = pRVar15;
            *(undefined4 *)((long)pvVar31 + 0x38) = 0;
            *(undefined1 *)((long)pvVar31 + 0x38) = 0x10;
            bVar16 = ((byte)local_2c8.task.part_first & 1) << 5 | 0x10;
            *(byte *)((long)pvVar31 + 0x38) = bVar16;
            *(byte *)((long)pvVar31 + 0x38) = ((byte)local_2c8.task.part_last & 1) << 6 | bVar16;
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),uVar28);
              _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n","try_proc_low_deley_task",
                         (ulong)local_2c8.task.part_count,pRVar15,in_stack_fffffffffffffcb8);
            }
            local_2c8.task.part_pos = pRVar34;
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                    local_2c8.task.part_count);
              _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld part %d\n",
                         "try_proc_low_deley_task",local_2c8.rc.frm.val >> 0x30,pMVar3->task_pts,
                         in_stack_fffffffffffffcb8);
            }
            mpp_task_meta_set_packet(pMVar3->task_out,KEY_OUTPUT_PACKET,pvVar31);
            _mpp_port_enqueue("try_proc_low_deley_task",pMVar3->output,pMVar3->task_out);
            pMVar3->task_out = (MppTask)0x0;
            local_2c8.task.part_count = 0;
            local_2c8.status.val = local_2c8.status.val & 0xfffffbff;
            RVar20 = mpp_time();
            pMVar3->time_end = RVar20;
            pMVar3->frame_count = pMVar3->frame_count + 1;
            if ((((pMVar3->dev != (MppDev)0x0) && (pMVar3->time_base != 0)) && (RVar20 != 0)) &&
               (999999 < RVar20 - pMVar3->time_base)) {
              update_hal_info_fps(pMVar3);
            }
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","try_proc_low_deley_task",
                         local_2c8.rc.frm.val >> 0x30);
            }
            MVar18 = rc_hal_end(pMVar3->rc_ctx,&local_2c8.rc);
            if (MVar18 == MPP_OK) break;
            in_stack_fffffffffffffcb8 =
                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
            pcVar27 = "mpp %p rc_hal_end:%-4d failed return %d";
            uVar32 = 0x99c;
          }
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","try_proc_low_deley_task",
                       local_2c8.rc.frm.val >> 0x30,pMVar3->task_pts);
          }
          mpp_task_meta_set_frame(pMVar3->task_in,KEY_INPUT_FRAME,pMVar3->frame);
          _mpp_port_enqueue("try_proc_low_deley_task",pMVar3->input,pMVar3->task_in);
          pMVar3->task_in = (MppTask)0x0;
          pMVar3->task_out = (MppTask)0x0;
          pMVar3->frame = (MppFrame)0x0;
          pMVar3->packet = (MppPacket)0x0;
          pMVar3->frm_buf = (MppBuffer)0x0;
          pMVar3->pkt_buf = (MppBuffer)0x0;
          (pMVar3->hdr_status).val = *(byte *)&pMVar3->hdr_status & 1;
          local_2c8.status.val = 0;
          local_2c8.usr.force_flag = 0;
        }
      }
    }
    goto LAB_0014115a;
  }
  goto LAB_00141186;
LAB_00140e5e:
  local_31c = local_31c | 8;
  local_2c8.status.val = local_2c8.status.val | 0x400;
LAB_0014115a:
  pthread_mutex_lock(local_2f0);
  MVar17 = MppThread::get_status(local_2d8,THREAD_WORK);
  bVar36 = MVar17 == MPP_THREAD_RUNNING;
  if (!bVar36) goto LAB_0014117c;
  goto LAB_0013e23e;
}

Assistant:

void *mpp_enc_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc  = enc->thread_enc;
    EncAsyncTaskInfo task;
    EncAsyncWait wait;
    EncAsyncStatus *status = &task.status;
    MPP_RET ret = MPP_OK;

    memset(&task, 0, sizeof(task));
    wait.val = 0;

    enc->time_base = mpp_time();

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_task_wait(enc, &wait))
                thd_enc->wait();
        }

        // When encoder is not on encoding process external config and reset
        if (!status->enc_start) {
            // 1. process user control
            if (enc->cmd_send != enc->cmd_recv) {
                enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                wait.val = 0;
                continue;
            }

            // 2. process reset
            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");
                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
                wait.val = 0;
                continue;
            }

            // 3. try get a task to encode
            ret = try_get_enc_task(enc, &task, &wait);
            if (ret)
                continue;
        }

        mpp_assert(status->enc_start);
        if (!status->enc_start)
            continue;

        // check partition low delay encoding
        /*
         * NOTE: Only when both split encoding and low delay mode are set then
         *       use special low delay path
         */
        if (enc->low_delay_part_mode)
            try_proc_low_deley_task(mpp, &task, &wait);
        else
            try_proc_normal_task(enc, &task);
    }

    // clear remain task in enc->output port
    release_task_in_port(enc->input);
    release_task_in_port(mpp->mUsrOutPort);

    return NULL;
}